

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O1

int stbi__process_marker(stbi__jpeg *z,int m)

{
  stbi__context *psVar1;
  byte bVar2;
  byte bVar3;
  stbi_uc sVar4;
  stbi_uc sVar5;
  sbyte sVar6;
  ushort uVar7;
  uint uVar8;
  int iVar9;
  int ok;
  long lVar10;
  uint uVar11;
  uint uVar12;
  ulong uVar13;
  int i_1;
  int iVar14;
  ulong uVar15;
  long lVar16;
  bool bVar17;
  int sizes [16];
  uint local_78 [18];
  
  if (m < 0xdd) {
    if (m == 0xc4) {
      psVar1 = z->s;
      bVar2 = stbi__get8(psVar1);
      bVar3 = stbi__get8(psVar1);
      iVar14 = (uint)bVar2 * 0x100 + (uint)bVar3 + -2;
      do {
        if (iVar14 < 1) goto LAB_001993cf;
        bVar2 = stbi__get8(z->s);
        if ((bVar2 & 0xf) < 4 && bVar2 < 0x20) {
          lVar16 = 0;
          uVar8 = 0;
          do {
            bVar3 = stbi__get8(z->s);
            local_78[lVar16] = (uint)bVar3;
            uVar8 = uVar8 + bVar3;
            lVar16 = lVar16 + 1;
          } while (lVar16 != 0x10);
          iVar14 = iVar14 + -0x11;
          uVar15 = (ulong)bVar2 & 0xf;
          if (bVar2 < 0x10) {
            iVar9 = stbi__build_huffman(z->huff_dc + uVar15,(int *)local_78);
            lVar16 = 8;
          }
          else {
            iVar9 = stbi__build_huffman(z->huff_ac + uVar15,(int *)local_78);
            lVar16 = 0x1a48;
          }
          if (iVar9 == 0) goto LAB_001993c3;
          if (uVar8 != 0) {
            uVar13 = 0;
            do {
              sVar4 = stbi__get8(z->s);
              z->huff_dc[uVar15].values[uVar13 + lVar16 + -8] = sVar4;
              uVar13 = uVar13 + 1;
            } while (uVar8 != uVar13);
          }
          if (0xf < bVar2) {
            lVar16 = (ulong)(uint)((int)uVar15 << 10) + 0x3688;
            lVar10 = 0;
            do {
              uVar13 = (ulong)z->huff_ac[uVar15].fast[lVar10];
              *(undefined2 *)((long)z->fast_ac[0] + lVar10 * 2 + lVar16 + -0x3688) = 0;
              if (uVar13 != 0xff) {
                bVar2 = z->huff_ac[uVar15].values[uVar13];
                if ((bVar2 & 0xf) != 0) {
                  bVar3 = z->huff_ac[uVar15].size[uVar13];
                  uVar7 = (bVar2 & 0xf) + (ushort)bVar3;
                  if (uVar7 < 10) {
                    uVar12 = (int)lVar10 << (bVar3 & 0x1f) & 0x1ff;
                    sVar6 = (sbyte)(bVar2 & 0xf);
                    uVar11 = -1 << sVar6 | 1;
                    if (0xff < uVar12) {
                      uVar11 = 0;
                    }
                    iVar9 = uVar11 + (uVar12 >> (9U - sVar6 & 0x1f));
                    if ((char)iVar9 == iVar9) {
                      *(ushort *)((long)z->fast_ac[0] + lVar10 * 2 + lVar16 + -0x3688) =
                           (short)iVar9 * 0x100 | bVar2 & 0xfff0 | uVar7;
                    }
                  }
                }
              }
              lVar10 = lVar10 + 1;
            } while (lVar10 != 0x200);
          }
          iVar14 = iVar14 - uVar8;
          bVar17 = true;
        }
        else {
          stbi__g_failure_reason = "bad DHT header";
LAB_001993c3:
          bVar17 = false;
        }
      } while (bVar17);
    }
    else if (m == 0xdb) {
      psVar1 = z->s;
      bVar2 = stbi__get8(psVar1);
      bVar3 = stbi__get8(psVar1);
      iVar14 = (uint)bVar3 + (uint)bVar2 * 0x100 + -2;
      do {
        if (iVar14 < 1) goto LAB_001993cf;
        bVar2 = stbi__get8(z->s);
        if ((bVar2 & 0xfffffff0) == 0x10 || bVar2 < 0x10) {
          uVar8 = bVar2 & 0xf;
          if (3 < uVar8) {
            stbi__g_failure_reason = "bad DQT table";
            goto LAB_001990a2;
          }
          lVar16 = 0;
          do {
            psVar1 = z->s;
            bVar3 = stbi__get8(psVar1);
            uVar7 = (ushort)bVar3;
            if (0xf < bVar2) {
              sVar4 = stbi__get8(psVar1);
              uVar7 = CONCAT11(bVar3,sVar4);
            }
            *(ushort *)((long)z->dequant[0] + (ulong)""[lVar16] * 2 + (ulong)(uVar8 << 7)) = uVar7;
            lVar16 = lVar16 + 1;
          } while (lVar16 != 0x40);
          iVar14 = iVar14 + (uint)(bVar2 < 0x10) * 0x40 + -0x81;
          bVar17 = true;
        }
        else {
          stbi__g_failure_reason = "bad DQT type";
LAB_001990a2:
          bVar17 = false;
        }
      } while (bVar17);
    }
    else {
LAB_00199167:
      if (m == 0xfe || (m & 0xfffffff0U) == 0xe0) {
        psVar1 = z->s;
        sVar4 = stbi__get8(psVar1);
        sVar5 = stbi__get8(psVar1);
        uVar8 = (uint)CONCAT11(sVar4,sVar5);
        if (1 < uVar8) {
          if ((m == 0xe0) && (6 < uVar8)) {
            bVar17 = true;
            lVar16 = 0;
            do {
              sVar4 = stbi__get8(z->s);
              if (sVar4 != "JFIF"[lVar16]) {
                bVar17 = false;
              }
              lVar16 = lVar16 + 1;
            } while (lVar16 != 5);
            iVar14 = uVar8 - 7;
            if (bVar17) {
              z->jfif = 1;
            }
          }
          else {
            iVar14 = uVar8 - 2;
            if ((m == 0xee) && (0xd < uVar8)) {
              bVar17 = true;
              lVar16 = 0;
              do {
                sVar4 = stbi__get8(z->s);
                if (sVar4 != "Adobe"[lVar16]) {
                  bVar17 = false;
                }
                lVar16 = lVar16 + 1;
              } while (lVar16 != 6);
              if (bVar17) {
                stbi__get8(z->s);
                stbi__get16be(z->s);
                stbi__get16be(z->s);
                bVar2 = stbi__get8(z->s);
                z->app14_color_transform = (uint)bVar2;
                iVar14 = uVar8 - 0xe;
              }
              else {
                iVar14 = uVar8 - 8;
              }
            }
          }
          stbi__skip(z->s,iVar14);
          goto LAB_0019952c;
        }
        if (m == 0xfe) {
          stbi__g_failure_reason = "bad COM len";
        }
        else {
          stbi__g_failure_reason = "bad APP len";
        }
      }
      else {
        stbi__g_failure_reason = "unknown marker";
      }
    }
  }
  else if (m == 0xdd) {
    psVar1 = z->s;
    sVar4 = stbi__get8(psVar1);
    sVar5 = stbi__get8(psVar1);
    if (CONCAT11(sVar4,sVar5) == 4) {
      psVar1 = z->s;
      sVar4 = stbi__get8(psVar1);
      sVar5 = stbi__get8(psVar1);
      z->restart_interval = (uint)CONCAT11(sVar4,sVar5);
LAB_0019952c:
      bVar17 = true;
      goto LAB_00199439;
    }
    stbi__g_failure_reason = "bad DRI len";
  }
  else {
    if (m != 0xff) goto LAB_00199167;
    stbi__g_failure_reason = "expected marker";
  }
  bVar17 = false;
LAB_00199439:
  return (int)bVar17;
LAB_001993cf:
  bVar17 = iVar14 == 0;
  goto LAB_00199439;
}

Assistant:

static int stbi__process_marker(stbi__jpeg *z, int m)
{
   int L;
   switch (m) {
      case STBI__MARKER_none: // no marker found
         return stbi__err("expected marker","Corrupt JPEG");

      case 0xDD: // DRI - specify restart interval
         if (stbi__get16be(z->s) != 4) return stbi__err("bad DRI len","Corrupt JPEG");
         z->restart_interval = stbi__get16be(z->s);
         return 1;

      case 0xDB: // DQT - define quantization table
         L = stbi__get16be(z->s)-2;
         while (L > 0) {
            int q = stbi__get8(z->s);
            int p = q >> 4, sixteen = (p != 0);
            int t = q & 15,i;
            if (p != 0 && p != 1) return stbi__err("bad DQT type","Corrupt JPEG");
            if (t > 3) return stbi__err("bad DQT table","Corrupt JPEG");

            for (i=0; i < 64; ++i)
               z->dequant[t][stbi__jpeg_dezigzag[i]] = sixteen ? stbi__get16be(z->s) : stbi__get8(z->s);
            L -= (sixteen ? 129 : 65);
         }
         return L==0;

      case 0xC4: // DHT - define huffman table
         L = stbi__get16be(z->s)-2;
         while (L > 0) {
            stbi_uc *v;
            int sizes[16],i,n=0;
            int q = stbi__get8(z->s);
            int tc = q >> 4;
            int th = q & 15;
            if (tc > 1 || th > 3) return stbi__err("bad DHT header","Corrupt JPEG");
            for (i=0; i < 16; ++i) {
               sizes[i] = stbi__get8(z->s);
               n += sizes[i];
            }
            L -= 17;
            if (tc == 0) {
               if (!stbi__build_huffman(z->huff_dc+th, sizes)) return 0;
               v = z->huff_dc[th].values;
            } else {
               if (!stbi__build_huffman(z->huff_ac+th, sizes)) return 0;
               v = z->huff_ac[th].values;
            }
            for (i=0; i < n; ++i)
               v[i] = stbi__get8(z->s);
            if (tc != 0)
               stbi__build_fast_ac(z->fast_ac[th], z->huff_ac + th);
            L -= n;
         }
         return L==0;
   }

   // check for comment block or APP blocks
   if ((m >= 0xE0 && m <= 0xEF) || m == 0xFE) {
      L = stbi__get16be(z->s);
      if (L < 2) {
         if (m == 0xFE)
            return stbi__err("bad COM len","Corrupt JPEG");
         else
            return stbi__err("bad APP len","Corrupt JPEG");
      }
      L -= 2;

      if (m == 0xE0 && L >= 5) { // JFIF APP0 segment
         static const unsigned char tag[5] = {'J','F','I','F','\0'};
         int ok = 1;
         int i;
         for (i=0; i < 5; ++i)
            if (stbi__get8(z->s) != tag[i])
               ok = 0;
         L -= 5;
         if (ok)
            z->jfif = 1;
      } else if (m == 0xEE && L >= 12) { // Adobe APP14 segment
         static const unsigned char tag[6] = {'A','d','o','b','e','\0'};
         int ok = 1;
         int i;
         for (i=0; i < 6; ++i)
            if (stbi__get8(z->s) != tag[i])
               ok = 0;
         L -= 6;
         if (ok) {
            stbi__get8(z->s); // version
            stbi__get16be(z->s); // flags0
            stbi__get16be(z->s); // flags1
            z->app14_color_transform = stbi__get8(z->s); // color transform
            L -= 6;
         }
      }

      stbi__skip(z->s, L);
      return 1;
   }

   return stbi__err("unknown marker","Corrupt JPEG");
}